

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O0

void PHYSFS_utf8FromUtf16(PHYSFS_uint16 *src,char *dst,PHYSFS_uint64 len)

{
  PHYSFS_uint32 cp_00;
  PHYSFS_uint64 PStack_20;
  PHYSFS_uint32 cp;
  PHYSFS_uint64 len_local;
  char *dst_local;
  PHYSFS_uint16 *src_local;
  
  if (len != 0) {
    PStack_20 = len - 1;
    len_local = (PHYSFS_uint64)dst;
    dst_local = (char *)src;
    while ((PStack_20 != 0 && (cp_00 = utf16codepoint((PHYSFS_uint16 **)&dst_local), cp_00 != 0))) {
      utf8fromcodepoint(cp_00,(char **)&len_local,&stack0xffffffffffffffe0);
    }
    *(undefined1 *)len_local = 0;
  }
  return;
}

Assistant:

void PHYSFS_utf8FromUtf16(const PHYSFS_uint16 *src, char *dst, PHYSFS_uint64 len)
{
    if (len == 0)
        return;

    len--;
    while (len)
    {
        const PHYSFS_uint32 cp = utf16codepoint(&src);
        if (!cp)
            break;
        utf8fromcodepoint(cp, &dst, &len);
    } /* while */

    *dst = '\0';
}